

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.c
# Opt level: O0

void listener_accept_cb(void *arg)

{
  nng_err num;
  uint32_t uVar1;
  nni_pipe *p;
  char *pcVar2;
  int rv;
  nni_aio *aio;
  nni_listener *l;
  void *arg_local;
  
  num = nni_aio_result((nni_aio *)((long)arg + 0xb8));
  if (num == NNG_OK) {
    nni_stat_inc((nni_stat_item *)((long)arg + 0x618),1);
    p = (nni_pipe *)nni_aio_get_output((nni_aio *)((long)arg + 0xb8),0);
    nni_pipe_start(p);
    listener_accept_start((nni_listener *)arg);
    return;
  }
  if (num == NNG_ETIMEDOUT) {
LAB_0011c8fc:
    uVar1 = nni_sock_id(*(nni_sock **)((long)arg + 0x90));
    pcVar2 = nng_strerror(num);
    nng_log_warn("NNG-ACCEPT-FAIL","Failed accepting for socket<%u>: %s",(ulong)uVar1,pcVar2);
    nni_listener_bump_error((nni_listener *)arg,num);
    listener_accept_start((nni_listener *)arg);
  }
  else {
    if (num != NNG_ECLOSED) {
      if (num - NNG_ECONNABORTED < 2) goto LAB_0011c8fc;
      if (num != NNG_ECANCELED) {
        if (num == NNG_EPEERAUTH) goto LAB_0011c8fc;
        if (num != NNG_ESTOPPED) {
          nni_listener_bump_error((nni_listener *)arg,num);
          nni_sleep_aio(100,(nng_aio *)((long)arg + 0x280));
          return;
        }
      }
    }
    nni_listener_bump_error((nni_listener *)arg,num);
  }
  return;
}

Assistant:

static void
listener_accept_cb(void *arg)
{
	nni_listener *l   = arg;
	nni_aio      *aio = &l->l_acc_aio;
	int           rv;

	switch ((rv = nni_aio_result(aio))) {
	case 0:
#ifdef NNG_ENABLE_STATS
		nni_stat_inc(&l->st_accept, 1);
#endif
		nni_pipe_start(nni_aio_get_output(aio, 0));
		listener_accept_start(l);
		break;
	case NNG_ECONNABORTED: // remote condition, no cool down
	case NNG_ECONNRESET:   // remote condition, no cool down
	case NNG_ETIMEDOUT:    // No need to sleep, we timed out already.
	case NNG_EPEERAUTH:    // peer validation failure
		nng_log_warn("NNG-ACCEPT-FAIL",
		    "Failed accepting for socket<%u>: %s",
		    nni_sock_id(l->l_sock), nng_strerror(rv));
		nni_listener_bump_error(l, rv);
		listener_accept_start(l);
		break;
	case NNG_ESTOPPED:  // no further action
	case NNG_ECLOSED:   // no further action
	case NNG_ECANCELED: // no further action
		nni_listener_bump_error(l, rv);
		break;
	default:
		// We don't really know why we failed, but we back off
		// here. This is because errors here are probably due
		// to system failures (resource exhaustion) and we hope
		// by not thrashing we give the system a chance to
		// recover.  100 ms is enough to cool down.
		nni_listener_bump_error(l, rv);
		nni_sleep_aio(100, &l->l_tmo_aio);
		break;
	}
}